

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_syntax.hpp
# Opt level: O2

size_t jessilib::fail_action<char32_t,jessilib::json_context<char32_t,true>,true>
                 (decode_result param_1,json_context<char32_t,_true> *param_2,
                 basic_string_view<char32_t,_std::char_traits<char32_t>_> *in_read_view)

{
  invalid_argument *this;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *in_R8;
  bool bVar1;
  undefined8 local_68;
  char8_t *local_60;
  string local_58;
  char32_t local_38 [2];
  char8_t *local_30;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_28;
  
  this = (invalid_argument *)__cxa_allocate_exception(0x10,param_1.units);
  local_68 = 0x27;
  local_60 = "Invalid parse data; unexpected token: \'";
  bVar1 = in_read_view->_M_len != 0;
  if (bVar1) {
    local_28._M_len._0_4_ = *in_read_view->_M_str;
  }
  else {
    local_28._M_len._0_4_ = L'\0';
  }
  local_28._M_str = (char8_t *)(ulong)bVar1;
  local_38[0] = L'\x13';
  local_38[1] = L'\0';
  local_30 = "\' when parsing data";
  join_mbstring<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char32_t,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
            (&local_58,(jessilib *)&local_68,&local_28,local_38,in_R8);
  std::invalid_argument::invalid_argument(this,(string *)&local_58);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

size_t fail_action(decode_result, ContextT&, std::basic_string_view<CharT>& in_read_view) {
	using namespace std::literals;
	if constexpr (UseExceptionsV) {
		throw std::invalid_argument{ jessilib::join_mbstring(u8"Invalid parse data; unexpected token: '"sv,
			jessilib::decode_codepoint(in_read_view).codepoint,
			u8"' when parsing data"sv) };
	}
	return std::numeric_limits<size_t>::max();
}